

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::LabelStyle> __thiscall gui::DefaultTheme::makeLabelStyle(DefaultTheme *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::LabelStyle> sVar1;
  shared_ptr<gui::LabelStyle> *style;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  LabelStyle *in_stack_ffffffffffffffa0;
  Gui *in_stack_ffffffffffffffc8;
  Vector3<float> local_30 [2];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<gui::LabelStyle,gui::Gui_const&>(in_stack_ffffffffffffffc8);
  std::__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a28d);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffffa0);
  LabelStyle::setFont(in_stack_ffffffffffffffa0,
                      (Font *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a2c2);
  LabelStyle::setCharacterSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  std::__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a2db);
  LabelStyle::setTextFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = std::__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16a2f6);
  sf::Vector3<float>::Vector3(local_30,8.0,1.0,*(float *)(in_RSI + 0x50));
  LabelStyle::setTextPadding
            (this_00,(Vector3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::LabelStyle>)
         sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LabelStyle> DefaultTheme::makeLabelStyle() const {
    auto style = std::make_shared<LabelStyle>(gui_);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}